

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option.cpp
# Opt level: O2

void __thiscall ncnn::Option::Option(Option *this)

{
  int iVar1;
  
  this->lightmode = true;
  iVar1 = get_cpu_count();
  this->num_threads = iVar1;
  this->blob_allocator = (Allocator *)0x0;
  this->workspace_allocator = (Allocator *)0x0;
  this->use_winograd_convolution = true;
  this->use_sgemm_convolution = true;
  this->use_int8_inference = true;
  this->use_vulkan_compute = false;
  this->use_fp16_packed = true;
  this->use_fp16_storage = true;
  this->use_fp16_arithmetic = false;
  this->use_int8_storage = true;
  this->use_int8_arithmetic = false;
  this->use_packing_layout = false;
  if (iVar1 < 1) {
    this->num_threads = 1;
  }
  return;
}

Assistant:

Option::Option()
{
    lightmode = true;
    num_threads = get_cpu_count();
    blob_allocator = 0;
    workspace_allocator = 0;

#if NCNN_VULKAN
    blob_vkallocator = 0;
    workspace_vkallocator = 0;
    staging_vkallocator = 0;
#endif // NCNN_VULKAN

    use_winograd_convolution = true;
    use_sgemm_convolution = true;
    use_int8_inference = true;
    use_vulkan_compute = false;// TODO enable me

    use_fp16_packed = true;
    use_fp16_storage = true;
    use_fp16_arithmetic = false;
    use_int8_storage = true;
    use_int8_arithmetic = false;

    use_packing_layout = false;

    // sanitize
    if (num_threads <= 0)
        num_threads = 1;
}